

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O2

bool __thiscall Clasp::SolveAlgorithm::reportUnsat(SolveAlgorithm *this,Solver *s)

{
  ModelHandler *pMVar1;
  LogPtr pEVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  byte bVar6;
  
  pMVar1 = this->onModel_;
  lVar5 = ((this->enum_).ptr_ & 0xfffffffffffffffe) + 0x48;
  pEVar2 = s->shared_->progress_;
  bVar4 = 1;
  bVar6 = 1;
  if (pMVar1 != (ModelHandler *)0x0) {
    iVar3 = (*pMVar1->_vptr_ModelHandler[3])(pMVar1,s,lVar5);
    bVar6 = (byte)iVar3;
  }
  if (pEVar2 != (LogPtr)0x0) {
    iVar3 = (*(pEVar2->super_ModelHandler)._vptr_ModelHandler[3])(pEVar2,s,lVar5);
    bVar4 = (byte)iVar3;
  }
  return (bool)(bVar6 & bVar4);
}

Assistant:

bool SolveAlgorithm::reportUnsat(Solver& s) const {
	const Model&  m = model();
	EventHandler* h = s.sharedContext()->eventHandler();
	bool r1 = !onModel_ || onModel_->onUnsat(s, m);
	bool r2 = !h || h->onUnsat(s, m);
	return r1 && r2;
}